

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameTypes.cpp
# Opt level: O3

void __thiscall wasm::NameTypes::run(NameTypes *this,Module *module)

{
  uint uVar1;
  pointer *ppHVar2;
  char *pcVar3;
  bool bVar4;
  pointer pHVar5;
  char cVar6;
  const_iterator cVar7;
  mapped_type *pmVar8;
  long *plVar9;
  size_type sVar10;
  undefined1 reuse;
  ulong uVar11;
  size_type *psVar12;
  unordered_map<wasm::HeapType,_wasm::TypeNames,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>_>
  *this_00;
  char cVar13;
  ulong __val;
  undefined1 auVar14 [8];
  string_view sVar15;
  string_view s;
  string_view s_00;
  string_view s_01;
  undefined1 local_d0 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  used;
  undefined1 local_88 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> types;
  string __str;
  string name;
  
  wasm::ModuleUtils::collectHeapTypes
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_88,module);
  pHVar5 = types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_d0 = (undefined1  [8])&used._M_h._M_rehash_policy._M_next_resize;
  used._M_h._M_buckets = (__buckets_ptr)0x1;
  used._M_h._M_bucket_count = 0;
  used._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  used._M_h._M_element_count._0_4_ = 0x3f800000;
  used._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  used._M_h._M_rehash_policy._4_4_ = 0;
  used._M_h._M_rehash_policy._M_next_resize = 0;
  if (local_88 !=
      (undefined1  [8])
      types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    this_00 = &module->typeNames;
    __val = 0;
    auVar14 = local_88;
    do {
      cVar7 = std::
              _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&this_00->_M_h,(key_type *)auVar14);
      if (cVar7.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
          _M_cur == (__node_type *)0x0) {
LAB_00992ec8:
        cVar13 = '\x01';
        if (9 < __val) {
          uVar11 = __val;
          cVar6 = '\x04';
          do {
            cVar13 = cVar6;
            if (uVar11 < 100) {
              cVar13 = cVar13 + -2;
              goto LAB_00992f22;
            }
            if (uVar11 < 1000) {
              cVar13 = cVar13 + -1;
              goto LAB_00992f22;
            }
            if (uVar11 < 10000) goto LAB_00992f22;
            bVar4 = 99999 < uVar11;
            uVar11 = uVar11 / 10000;
            cVar6 = cVar13 + '\x04';
          } while (bVar4);
          cVar13 = cVar13 + '\x01';
        }
LAB_00992f22:
        types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&__str._M_string_length;
        ppHVar2 = &types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct((ulong)ppHVar2,cVar13);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (uint)__str._M_dataplus._M_p,__val);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)ppHVar2,0,(char *)0x0,0xdf2728);
        psVar12 = (size_type *)(plVar9 + 2);
        if ((size_type *)*plVar9 == psVar12) {
          name._M_string_length = *psVar12;
          name.field_2._M_allocated_capacity = plVar9[3];
          __str.field_2._8_8_ = &name._M_string_length;
        }
        else {
          name._M_string_length = *psVar12;
          __str.field_2._8_8_ = (size_type *)*plVar9;
        }
        name._M_dataplus._M_p = (pointer)plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        sVar15._M_str = (char *)0x0;
        sVar15._M_len = __str.field_2._8_8_;
        sVar15 = IString::interned((IString *)name._M_dataplus._M_p,sVar15,SUB81(psVar12,0));
        pmVar8 = std::__detail::
                 _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this_00,(key_type *)auVar14);
        (pmVar8->name).super_IString.str = sVar15;
        if ((size_type *)__str.field_2._8_8_ != &name._M_string_length) {
          operator_delete((void *)__str.field_2._8_8_,name._M_string_length + 1);
        }
        if (types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)&__str._M_string_length) {
          operator_delete(types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                          __str._M_string_length + 1);
        }
        __val = __val + 1;
      }
      else {
        pmVar8 = std::__detail::
                 _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this_00,(key_type *)auVar14);
        if (0x13 < (pmVar8->name).super_IString.str._M_len) goto LAB_00992ec8;
      }
      pmVar8 = std::__detail::
               _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00,(key_type *)auVar14);
      __str.field_2._8_8_ = local_d0;
      std::
      _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__str.field_2._8_8_,pmVar8,(undefined1 *)((long)&__str.field_2 + 8));
      auVar14 = (undefined1  [8])((long)auVar14 + 8);
    } while (auVar14 != (undefined1  [8])pHVar5);
    if (local_88 !=
        (undefined1  [8])
        types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start) {
      auVar14 = local_88;
      do {
        pmVar8 = std::__detail::
                 _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this_00,(key_type *)auVar14);
        pcVar3 = (pmVar8->name).super_IString.str._M_str;
        __str.field_2._8_8_ = &name._M_string_length;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)((long)&__str.field_2 + 8),pcVar3,
                   pcVar3 + (pmVar8->name).super_IString.str._M_len);
        while ((pointer)0x1 < name._M_dataplus._M_p) {
          uVar1 = (int)name._M_dataplus._M_p[__str.field_2._8_8_ + -1] - 0x30;
          reuse = (undefined1)uVar1;
          if (9 < uVar1) {
            if (name._M_dataplus._M_p[__str.field_2._8_8_ + -1] == '_') {
              std::__cxx11::string::pop_back();
              s._M_str = (char *)0x0;
              s._M_len = __str.field_2._8_8_;
              join_0x00000010_0x00000000_ =
                   IString::interned((IString *)name._M_dataplus._M_p,s,(bool)reuse);
              sVar10 = std::
                       _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                *)local_d0,
                               (key_type *)
                               &types.
                                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
              if (sVar10 == 0) {
                s_00._M_str = (char *)0x0;
                s_00._M_len = __str.field_2._8_8_;
                sVar15 = IString::interned((IString *)name._M_dataplus._M_p,s_00,(bool)reuse);
                (pmVar8->name).super_IString.str = sVar15;
                s_01._M_str = (char *)0x0;
                s_01._M_len = __str.field_2._8_8_;
                join_0x00000010_0x00000000_ =
                     IString::interned((IString *)name._M_dataplus._M_p,s_01,(bool)reuse);
                used._M_h._M_single_bucket = (__node_base_ptr)local_d0;
                std::
                _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                ::
                _M_insert<wasm::Name,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                          ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            *)used._M_h._M_single_bucket,
                           &types.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           &used._M_h._M_single_bucket);
              }
            }
            break;
          }
          std::__cxx11::string::pop_back();
        }
        if ((size_type *)__str.field_2._8_8_ != &name._M_string_length) {
          operator_delete((void *)__str.field_2._8_8_,name._M_string_length + 1);
        }
        auVar14 = (undefined1  [8])((long)auVar14 + 8);
      } while (auVar14 !=
               (undefined1  [8])
               types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_start);
    }
  }
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_d0);
  if (local_88 != (undefined1  [8])0x0) {
    operator_delete((void *)local_88,
                    (long)types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_88);
  }
  return;
}

Assistant:

void run(Module* module) override {
    // Find all the types.
    std::vector<HeapType> types = ModuleUtils::collectHeapTypes(*module);

    std::unordered_set<Name> used;

    // Ensure simple names. If a name already exists, and is short enough, keep
    // it.
    size_t i = 0;
    for (auto& type : types) {
      if (module->typeNames.count(type) == 0 ||
          module->typeNames[type].name.size() >= NameLenLimit) {
        module->typeNames[type].name = "type_" + std::to_string(i++);
      }
      used.insert(module->typeNames[type].name);
    }

    // "Lint" the names a little. In particular a name with a "_7" or such
    // suffix, as TypeSSA creates, can be removed if it does not cause a
    // collision. This keeps the names unique while removing 'noise.'
    //
    // Note we must iterate in a deterministic order here, so do it on |types|.
    for (auto& type : types) {
      auto& names = module->typeNames[type];
      std::string name = names.name.toString();
      while (name.size() > 1 && isdigit(name.back())) {
        name.pop_back();
      }
      if (name.size() > 1 && name.back() == '_') {
        name.pop_back();
        if (!used.count(name)) {
          names.name = name;
          used.insert(name);
        }
      }
    }
  }